

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O0

int __thiscall ncnn::ParamDict::load_param(ParamDict *this,DataReader *dr)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  size_type sVar4;
  undefined4 uVar5;
  long *in_RSI;
  long in_RDI;
  float fVar6;
  int v_1;
  int v;
  vector<int,_std::allocator<int>_> ai;
  vector<float,_std::allocator<float>_> af;
  bool is_float;
  char vstr2 [256];
  bool is_string;
  int nscan;
  char comma [4];
  char vstr [16];
  int *ptr_1;
  float *ptr;
  bool is_float_1;
  char vstr_1 [16];
  int j;
  int nscan_1;
  int len;
  bool is_array;
  int id;
  value_type_conflict4 *in_stack_fffffffffffffca8;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffcb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcb8;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffcc0;
  float *in_stack_fffffffffffffcc8;
  Mat *in_stack_fffffffffffffcd0;
  int in_stack_fffffffffffffce0;
  float in_stack_fffffffffffffce4;
  char *in_stack_fffffffffffffce8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcf0;
  undefined4 in_stack_fffffffffffffd30;
  undefined4 in_stack_fffffffffffffd34;
  undefined4 local_2c0;
  float local_2bc;
  vector<int,_std::allocator<int>_> local_2b8;
  vector<float,_std::allocator<float>_> local_2a0;
  byte local_282;
  allocator<char> local_281;
  string local_280 [39];
  allocator<char> local_259;
  string local_258 [39];
  allocator<char> local_231;
  string local_230 [32];
  string local_210 [55];
  allocator<char> local_1d9;
  string local_1d8 [32];
  string local_1b8 [32];
  undefined1 local_198 [241];
  char local_a7;
  undefined1 local_91;
  int local_90;
  undefined1 local_8c [4];
  char local_88 [24];
  long local_70;
  long local_68;
  byte local_59;
  undefined1 local_58 [28];
  int local_3c;
  int local_38;
  int local_34;
  undefined1 local_2d;
  uint local_2c;
  long *local_28;
  int local_14;
  long *local_10;
  long *local_8;
  
  local_28 = in_RSI;
  clear((ParamDict *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
  local_2c = 0;
  do {
    while( true ) {
      while( true ) {
        while( true ) {
          iVar2 = (**(code **)(*local_28 + 0x10))(local_28,"%d=",&local_2c);
          if (iVar2 != 1) {
            return 0;
          }
          local_2d = (int)local_2c < -0x5b03;
          if ((bool)local_2d) {
            local_2c = 0xffffa4fc - local_2c;
          }
          if (0x1f < (int)local_2c) {
            fprintf(_stderr,"id < NCNN_MAX_PARAM_COUNT failed (id=%d, NCNN_MAX_PARAM_COUNT=%d)",
                    (ulong)local_2c,0x20);
            fprintf(_stderr,"\n");
            return -1;
          }
          if (!(bool)local_2d) break;
          local_34 = 0;
          local_38 = (**(code **)(*local_28 + 0x10))(local_28,"%d",&local_34);
          if (local_38 != 1) {
            fprintf(_stderr,"ParamDict read array length failed");
            fprintf(_stderr,"\n");
            return -1;
          }
          Mat::create(in_stack_fffffffffffffcd0,(int)((ulong)in_stack_fffffffffffffcc8 >> 0x20),
                      (size_t)in_stack_fffffffffffffcc0,(Allocator *)in_stack_fffffffffffffcb8);
          for (local_3c = 0; local_3c < local_34; local_3c = local_3c + 1) {
            local_38 = (**(code **)(*local_28 + 0x10))(local_28,",%15[^,\n ]",local_58);
            if (local_38 != 1) {
              fprintf(_stderr,"ParamDict read array element failed");
              fprintf(_stderr,"\n");
              return -1;
            }
            local_59 = vstr_is_float((char *)in_stack_fffffffffffffca8);
            if ((bool)local_59) {
              local_10 = (long *)(*(long *)(in_RDI + 8) + (long)(int)local_2c * 0x70 + 8);
              local_68 = *local_10;
              fVar6 = vstr_to_float((char *)CONCAT44(in_stack_fffffffffffffce4,
                                                     in_stack_fffffffffffffce0));
              *(float *)(local_68 + (long)local_3c * 4) = fVar6;
            }
            else {
              local_8 = (long *)(*(long *)(in_RDI + 8) + (long)(int)local_2c * 0x70 + 8);
              local_70 = *local_8;
              local_38 = __isoc99_sscanf(local_58,"%d",local_70 + (long)local_3c * 4);
              if (local_38 != 1) {
                fprintf(_stderr,"ParamDict parse array element failed");
                fprintf(_stderr,"\n");
                return -1;
              }
              local_38 = 1;
            }
            uVar5 = 5;
            if ((local_59 & 1) != 0) {
              uVar5 = 6;
            }
            *(undefined4 *)(*(long *)(in_RDI + 8) + (long)(int)local_2c * 0x70) = uVar5;
          }
        }
        local_90 = (**(code **)(*local_28 + 0x10))(local_28,"%15[^,\n ]",local_88);
        if (local_90 != 1) {
          fprintf(_stderr,"ParamDict read value failed");
          fprintf(_stderr,"\n");
          return -1;
        }
        local_91 = vstr_is_string((char *)in_stack_fffffffffffffcb0);
        if (!(bool)local_91) break;
        local_a7 = '\0';
        if (local_88[0] == '\"') {
          local_90 = (**(code **)(*local_28 + 0x10))(local_28,"%255[^\"\n]\"",local_198);
        }
        else {
          local_90 = (**(code **)(*local_28 + 0x10))(local_28,"%255[^\n ]",local_198);
        }
        if (local_90 == 1) {
          if (local_a7 != '\0') {
            fprintf(_stderr,"string too long (id=%d)",(ulong)local_2c);
            fprintf(_stderr,"\n");
            return -1;
          }
          if (local_88[0] == '\"') {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,
                       (allocator<char> *)
                       CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
            std::operator+(in_stack_fffffffffffffcb8,(char *)in_stack_fffffffffffffcb0);
            std::__cxx11::string::operator=
                      ((string *)(*(long *)(in_RDI + 8) + (long)(int)local_2c * 0x70 + 0x50),
                       local_1b8);
            std::__cxx11::string::~string(local_1b8);
            std::__cxx11::string::~string(local_1d8);
            std::allocator<char>::~allocator(&local_1d9);
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,
                       (allocator<char> *)
                       CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
            std::operator+(in_stack_fffffffffffffcb8,(char *)in_stack_fffffffffffffcb0);
            std::__cxx11::string::operator=
                      ((string *)(*(long *)(in_RDI + 8) + (long)(int)local_2c * 0x70 + 0x50),
                       local_210);
            std::__cxx11::string::~string(local_210);
            std::__cxx11::string::~string(local_230);
            std::allocator<char>::~allocator(&local_231);
          }
        }
        else if (local_88[0] == '\"') {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,
                     (allocator<char> *)
                     CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
          std::__cxx11::string::operator=
                    ((string *)(*(long *)(in_RDI + 8) + (long)(int)local_2c * 0x70 + 0x50),local_258
                    );
          std::__cxx11::string::~string(local_258);
          std::allocator<char>::~allocator(&local_259);
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,
                     (allocator<char> *)
                     CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
          std::__cxx11::string::operator=
                    ((string *)(*(long *)(in_RDI + 8) + (long)(int)local_2c * 0x70 + 0x50),local_280
                    );
          std::__cxx11::string::~string(local_280);
          std::allocator<char>::~allocator(&local_281);
        }
        in_stack_fffffffffffffcf0 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (*(long *)(in_RDI + 8) + (long)(int)local_2c * 0x70 + 0x50);
        std::__cxx11::string::size();
        pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)in_stack_fffffffffffffcf0);
        if (*pcVar3 == '\"') {
          in_stack_fffffffffffffce8 =
               (char *)(*(long *)(in_RDI + 8) + (long)(int)local_2c * 0x70 + 0x50);
          std::__cxx11::string::size();
          std::__cxx11::string::resize((ulong)in_stack_fffffffffffffce8);
        }
        *(undefined4 *)(*(long *)(in_RDI + 8) + (long)(int)local_2c * 0x70) = 7;
      }
      local_282 = vstr_is_float((char *)in_stack_fffffffffffffca8);
      local_90 = (**(code **)(*local_28 + 0x10))(local_28,"%1[,]",local_8c);
      local_2d = local_90 == 1;
      if ((bool)local_2d) break;
      if ((local_282 & 1) == 0) {
        local_90 = __isoc99_sscanf(local_88,"%d",
                                   *(long *)(in_RDI + 8) + (long)(int)local_2c * 0x70 + 4);
        if (local_90 != 1) {
          fprintf(_stderr,"ParamDict parse value failed");
          fprintf(_stderr,"\n");
          return -1;
        }
        local_90 = 1;
      }
      else {
        fVar6 = vstr_to_float((char *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0))
        ;
        *(float *)(*(long *)(in_RDI + 8) + (long)(int)local_2c * 0x70 + 4) = fVar6;
      }
      uVar5 = 2;
      if ((local_282 & 1) != 0) {
        uVar5 = 3;
      }
      *(undefined4 *)(*(long *)(in_RDI + 8) + (long)(int)local_2c * 0x70) = uVar5;
    }
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)0x16f226);
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x16f233);
    if ((local_282 & 1) == 0) {
      local_2c0 = 0;
      local_90 = __isoc99_sscanf(local_88,"%d",&local_2c0);
      if (local_90 == 1) {
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffcc0,
                   (value_type_conflict3 *)in_stack_fffffffffffffcb8);
        goto LAB_0016f354;
      }
      fprintf(_stderr,"ParamDict parse value failed");
      fprintf(_stderr,"\n");
      local_14 = -1;
      bVar1 = true;
    }
    else {
      in_stack_fffffffffffffce4 =
           vstr_to_float((char *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
      local_2bc = in_stack_fffffffffffffce4;
      std::vector<float,_std::allocator<float>_>::push_back
                (in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
LAB_0016f354:
      while (in_stack_fffffffffffffce0 =
                  (**(code **)(*local_28 + 0x10))(local_28,"%15[^,\n ]",local_88),
            local_90 = in_stack_fffffffffffffce0, in_stack_fffffffffffffce0 == 1) {
        if ((local_282 & 1) == 0) {
          local_90 = __isoc99_sscanf(local_88,"%d",&stack0xfffffffffffffd34);
          if (local_90 != 1) {
            fprintf(_stderr,"ParamDict parse value failed");
            fprintf(_stderr,"\n");
            local_14 = -1;
            bVar1 = true;
            goto LAB_0016f654;
          }
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffcc0,
                     (value_type_conflict3 *)in_stack_fffffffffffffcb8);
        }
        else {
          vstr_to_float((char *)CONCAT44(in_stack_fffffffffffffce4,1));
          std::vector<float,_std::allocator<float>_>::push_back
                    (in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
        }
        local_90 = (**(code **)(*local_28 + 0x10))(local_28,"%1[,]",local_8c);
        if (local_90 != 1) break;
        local_90 = 1;
      }
      iVar2 = (int)((ulong)in_stack_fffffffffffffcc8 >> 0x20);
      if ((local_282 & 1) == 0) {
        in_stack_fffffffffffffcb8 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (*(long *)(in_RDI + 8) + 8 + (long)(int)local_2c * 0x70);
        std::vector<int,_std::allocator<int>_>::size(&local_2b8);
        Mat::create(in_stack_fffffffffffffcd0,(int)((ulong)in_stack_fffffffffffffcc8 >> 0x20),
                    (size_t)in_stack_fffffffffffffcc0,(Allocator *)in_stack_fffffffffffffcb8);
        in_stack_fffffffffffffca8 =
             *(value_type_conflict4 **)(*(long *)(in_RDI + 8) + (long)(int)local_2c * 0x70 + 8);
        in_stack_fffffffffffffcb0 =
             (vector<float,_std::allocator<float>_> *)
             std::vector<int,_std::allocator<int>_>::data
                       ((vector<int,_std::allocator<int>_> *)0x16f5ec);
        sVar4 = std::vector<int,_std::allocator<int>_>::size(&local_2b8);
        memcpy(in_stack_fffffffffffffca8,in_stack_fffffffffffffcb0,sVar4 << 2);
      }
      else {
        in_stack_fffffffffffffcd0 = (Mat *)(*(long *)(in_RDI + 8) + 8 + (long)(int)local_2c * 0x70);
        std::vector<float,_std::allocator<float>_>::size(&local_2a0);
        Mat::create(in_stack_fffffffffffffcd0,iVar2,(size_t)in_stack_fffffffffffffcc0,
                    (Allocator *)in_stack_fffffffffffffcb8);
        in_stack_fffffffffffffcc0 =
             *(vector<float,_std::allocator<float>_> **)
              (*(long *)(in_RDI + 8) + (long)(int)local_2c * 0x70 + 8);
        in_stack_fffffffffffffcc8 =
             std::vector<float,_std::allocator<float>_>::data
                       ((vector<float,_std::allocator<float>_> *)0x16f549);
        sVar4 = std::vector<float,_std::allocator<float>_>::size(&local_2a0);
        memcpy(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcc8,sVar4 << 2);
      }
      uVar5 = 5;
      if ((local_282 & 1) != 0) {
        uVar5 = 6;
      }
      *(undefined4 *)(*(long *)(in_RDI + 8) + (long)(int)local_2c * 0x70) = uVar5;
      bVar1 = false;
    }
LAB_0016f654:
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffcc0);
    std::vector<float,_std::allocator<float>_>::~vector(in_stack_fffffffffffffcc0);
    if (bVar1) {
      return local_14;
    }
  } while( true );
}

Assistant:

int ParamDict::load_param(const DataReader& dr)
{
    clear();

    // 0=100 1=1.250000 -23303=5,0.1,0.2,0.4,0.8,1.0
    // 3=0.1,0.2,0.4,0.8,1.0

    // parse each key=value pair
    int id = 0;
    while (dr.scan("%d=", &id) == 1)
    {
        bool is_array = id <= -23300;
        if (is_array)
        {
            id = -id - 23300;
        }

        if (id >= NCNN_MAX_PARAM_COUNT)
        {
            NCNN_LOGE("id < NCNN_MAX_PARAM_COUNT failed (id=%d, NCNN_MAX_PARAM_COUNT=%d)", id, NCNN_MAX_PARAM_COUNT);
            return -1;
        }

        if (is_array)
        {
            // old style array
            int len = 0;
            int nscan = dr.scan("%d", &len);
            if (nscan != 1)
            {
                NCNN_LOGE("ParamDict read array length failed");
                return -1;
            }

            d->params[id].v.create(len);

            for (int j = 0; j < len; j++)
            {
                char vstr[16];
                nscan = dr.scan(",%15[^,\n ]", vstr);
                if (nscan != 1)
                {
                    NCNN_LOGE("ParamDict read array element failed");
                    return -1;
                }

                bool is_float = vstr_is_float(vstr);

                if (is_float)
                {
                    float* ptr = d->params[id].v;
                    ptr[j] = vstr_to_float(vstr);
                }
                else
                {
                    int* ptr = d->params[id].v;
                    nscan = sscanf(vstr, "%d", &ptr[j]);
                    if (nscan != 1)
                    {
                        NCNN_LOGE("ParamDict parse array element failed");
                        return -1;
                    }
                }

                d->params[id].type = is_float ? 6 : 5;
            }

            continue;
        }

        char vstr[16];
        char comma[4];
        int nscan = dr.scan("%15[^,\n ]", vstr);
        if (nscan != 1)
        {
            NCNN_LOGE("ParamDict read value failed");
            return -1;
        }

        bool is_string = vstr_is_string(vstr);
        if (is_string)
        {
            // scan the remaining string
            char vstr2[256];
            vstr2[241] = '\0'; // max 255 = 15 + 240
            if (vstr[0] == '\"')
            {
                nscan = dr.scan("%255[^\"\n]\"", vstr2);
            }
            else
            {
                nscan = dr.scan("%255[^\n ]", vstr2);
            }
            if (nscan == 1)
            {
                if (vstr2[241] != '\0')
                {
                    NCNN_LOGE("string too long (id=%d)", id);
                    return -1;
                }

                if (vstr[0] == '\"')
                    d->params[id].s = std::string(&vstr[1]) + vstr2;
                else
                    d->params[id].s = std::string(vstr) + vstr2;
            }
            else
            {
                if (vstr[0] == '\"')
                    d->params[id].s = std::string(&vstr[1]);
                else
                    d->params[id].s = std::string(vstr);
            }

            if (d->params[id].s[d->params[id].s.size() - 1] == '\"')
                d->params[id].s.resize(d->params[id].s.size() - 1);

            d->params[id].type = 7;

            continue;
        }

        bool is_float = vstr_is_float(vstr);

        nscan = dr.scan("%1[,]", comma);
        is_array = nscan == 1;

        if (is_array)
        {
            std::vector<float> af;
            std::vector<int> ai;

            if (is_float)
            {
                af.push_back(vstr_to_float(vstr));
            }
            else
            {
                int v = 0;
                nscan = sscanf(vstr, "%d", &v);
                if (nscan != 1)
                {
                    NCNN_LOGE("ParamDict parse value failed");
                    return -1;
                }

                ai.push_back(v);
            }

            while (1)
            {
                nscan = dr.scan("%15[^,\n ]", vstr);
                if (nscan != 1)
                {
                    break;
                }

                if (is_float)
                {
                    af.push_back(vstr_to_float(vstr));
                }
                else
                {
                    int v = 0;
                    nscan = sscanf(vstr, "%d", &v);
                    if (nscan != 1)
                    {
                        NCNN_LOGE("ParamDict parse value failed");
                        return -1;
                    }

                    ai.push_back(v);
                }

                nscan = dr.scan("%1[,]", comma);
                if (nscan != 1)
                {
                    break;
                }
            }

            if (is_float)
            {
                d->params[id].v.create((int)af.size());
                memcpy(d->params[id].v.data, af.data(), af.size() * 4);
            }
            else
            {
                d->params[id].v.create((int)ai.size());
                memcpy(d->params[id].v.data, ai.data(), ai.size() * 4);
            }

            d->params[id].type = is_float ? 6 : 5;
        }
        else
        {
            if (is_float)
            {
                d->params[id].f = vstr_to_float(vstr);
            }
            else
            {
                nscan = sscanf(vstr, "%d", &d->params[id].i);
                if (nscan != 1)
                {
                    NCNN_LOGE("ParamDict parse value failed");
                    return -1;
                }
            }

            d->params[id].type = is_float ? 3 : 2;
        }
    }

    return 0;
}